

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# master.cpp
# Opt level: O2

RpcValue __thiscall
miniros::master::Master::getParamNames(Master *this,string *caller_id,Connection *param_2)

{
  XmlRpcValue *pXVar1;
  anon_union_8_8_d5adaace_for__value extraout_RDX;
  int i;
  pointer pbVar2;
  RpcValue RVar3;
  RpcValue response;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  XmlRpcValue local_60;
  string s;
  
  XmlRpc::XmlRpcValue::Array((XmlRpcValue *)this,3);
  s._M_dataplus._M_p._0_4_ = 1;
  pXVar1 = XmlRpc::XmlRpcValue::operator[]((XmlRpcValue *)this,0);
  XmlRpc::XmlRpcValue::operator=(pXVar1,(int *)&s);
  pXVar1 = XmlRpc::XmlRpcValue::operator[]((XmlRpcValue *)this,1);
  XmlRpc::XmlRpcValue::operator=(pXVar1,"getParamNames");
  response._type = TypeInvalid;
  response._value.asDouble = 0.0;
  ParameterStorage::getParamNames
            (&local_78,(ParameterStorage *)(caller_id + 0x1d),(string *)param_2);
  i = 0;
  for (pbVar2 = local_78.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar2 != local_78.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pbVar2 = pbVar2 + 1) {
    ::std::__cxx11::string::string((string *)&s,(string *)pbVar2);
    XmlRpc::XmlRpcValue::XmlRpcValue(&local_60,&s);
    pXVar1 = XmlRpc::XmlRpcValue::operator[](&response,i);
    XmlRpc::XmlRpcValue::operator=(pXVar1,&local_60);
    XmlRpc::XmlRpcValue::~XmlRpcValue(&local_60);
    ::std::__cxx11::string::~string((string *)&s);
    i = i + 1;
  }
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_78);
  pXVar1 = XmlRpc::XmlRpcValue::operator[]((XmlRpcValue *)this,2);
  XmlRpc::XmlRpcValue::operator=(pXVar1,&response);
  XmlRpc::XmlRpcValue::~XmlRpcValue(&response);
  RVar3._value.asDouble = extraout_RDX.asDouble;
  RVar3._0_8_ = this;
  return RVar3;
}

Assistant:

Master::RpcValue Master::getParamNames(const std::string& caller_id, Connection*)
{
  RpcValue res = RpcValue::Array(3);
  res[0] = 1;
  res[1] = "getParamNames";

  RpcValue response;
  int index = 0;
  for (std::string s : m_parameterStorage.getParamNames(caller_id)) {
    response[index++] = s;
  }

  res[2] = response;
  return res;
}